

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::Scope::lookupName
          (Scope *this,string_view name,LookupLocation location,
          bitmask<slang::ast::LookupFlags> flags)

{
  bitmask<slang::ast::ASTFlags> flags_00;
  LookupLocation lookupLocation;
  LookupResult *this_00;
  ASTContext *in_RDI;
  ASTContext context;
  LookupResult result;
  LookupResult *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  Scope *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  bitmask<slang::ast::ASTFlags> local_2c0 [10];
  Symbol *local_270;
  Compilation *in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffe98;
  
  LookupResult::LookupResult(in_stack_fffffffffffffd00);
  bitmask<slang::ast::ASTFlags>::bitmask(local_2c0,None);
  lookupLocation._8_8_ = in_stack_fffffffffffffd20;
  lookupLocation.scope = in_stack_fffffffffffffd18;
  flags_00.m_bits._4_4_ = in_stack_fffffffffffffd14;
  flags_00.m_bits._0_4_ = in_stack_fffffffffffffd10;
  ASTContext::ASTContext(in_RDI,(Scope *)in_stack_fffffffffffffd00,lookupLocation,flags_00);
  this_00 = (LookupResult *)
            Compilation::parseName(in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
  Lookup::name((NameSyntax *)
               result.selectors.
               super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               .firstElement._24_8_,
               (ASTContext *)
               result.selectors.
               super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               .firstElement._16_8_,
               (bitmask<slang::ast::LookupFlags>)
               result.selectors.
               super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               .firstElement._36_4_,
               (LookupResult *)
               result.selectors.
               super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
               .firstElement._8_8_);
  LookupResult::~LookupResult(this_00);
  return local_270;
}

Assistant:

const Symbol* Scope::lookupName(std::string_view name, LookupLocation location,
                                bitmask<LookupFlags> flags) const {
    LookupResult result;
    ASTContext context(*this, location);
    Lookup::name(compilation.parseName(name), context, flags, result);
    SLANG_ASSERT(result.selectors.empty());
    return result.found;
}